

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

int main(void)

{
  _Rb_tree_header *p_Var1;
  cake_iterator<false> last;
  undefined1 auVar2 [24];
  undefined1 auVar3 [24];
  undefined1 auVar4 [24];
  int iVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar11;
  initializer_list<int> __l;
  initializer_list<double> l;
  multiset<int,_std::less<int>,_std::allocator<int>_> iset;
  vector<int,_std::allocator<int>_> v;
  skiplist<int,_std::less<int>_> iskip;
  skiplist<int,_std::less<int>_> skiplistFromVector;
  skiplist<double,_std::less<double>_> slFromInitializer;
  undefined8 in_stack_ffffffffffffe0e8;
  undefined4 in_stack_ffffffffffffe0f0;
  undefined4 in_stack_ffffffffffffe0f4;
  undefined1 in_stack_ffffffffffffe0f8;
  undefined7 in_stack_ffffffffffffe0f9;
  undefined8 in_stack_ffffffffffffe100;
  SLNode<double> *pSVar12;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1ee0;
  undefined8 local_1eb0;
  undefined1 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 local_1e98;
  undefined1 uStack_1e90;
  undefined8 local_1e88;
  vector<int,_std::allocator<int>_> local_1e80;
  double local_1e68 [3];
  skiplist<int,_std::less<int>_> local_1e50;
  skiplist<int,_std::less<int>_> local_1448;
  skiplist<double,_std::less<double>_> local_a38;
  
  p_Var1 = &local_1ee0._M_impl.super__Rb_tree_header;
  local_1ee0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar10 = 0;
  local_1ee0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1ee0._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar8 = 10;
  local_1ee0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_1ee0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    local_1e50.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = (int)uVar10 + (int)(uVar10 / 5) * -5;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_equal<int>(&local_1ee0,(int *)&local_1e50);
    uVar10 = (ulong)((int)uVar10 + 1);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  local_1e50.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  pVar11 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
           equal_range(&local_1ee0,(key_type *)&local_1e50);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            (&local_1ee0,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node);
  local_1e50.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  pVar11 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
           equal_range(&local_1ee0,(key_type *)&local_1e50);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            (&local_1ee0,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node);
  local_1e50.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  pVar11 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
           equal_range(&local_1ee0,(key_type *)&local_1e50);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            (&local_1ee0,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The mulitset has:\n",0x12);
  for (p_Var7 = local_1ee0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_Var7[1]._M_color);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  skiplist<int,_std::less<int>_>::skiplist(&local_1e50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Inserting into the skip list:\n",0x1e);
  uVar10 = 0;
  iVar8 = 10;
  do {
    iVar9 = (int)uVar10 + (int)(uVar10 / 5) * -5;
    skiplist<int,_std::less<int>_>::insert(&local_1e50,iVar9);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    uVar10 = (ulong)((int)uVar10 + 1);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  skiplist<int,_std::less<int>_>::erase(&local_1e50,0);
  skiplist<int,_std::less<int>_>::erase(&local_1e50,0);
  skiplist<int,_std::less<int>_>::erase(&local_1e50,2);
  foundit(&local_1e50,2);
  foundit(&local_1e50,7);
  local_1448.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x40000000a;
  local_1448.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x600000003;
  local_1448.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_1448;
  std::vector<int,_std::allocator<int>_>::vector(&local_1e80,__l,(allocator_type *)&local_a38);
  skiplist<int,std::less<int>>::
  skiplist<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((skiplist<int,std::less<int>> *)&local_1448,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_1e80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_1e80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Skiplist constructed from vector:\n",0x22);
  if (local_1448.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1448.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar8 = 0;
  }
  else {
    iVar8 = 0;
    if ((*local_1448.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
          super__Vector_impl_data._M_start)->next != (SLNode<int> *)0x0) {
      iVar8 = (*local_1448.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->next->count + -1;
    }
  }
  local_1e88 = 0;
  local_1e98 = 0;
  uStack_1e90 = 0;
  auVar2._8_4_ = in_stack_ffffffffffffe0f0;
  auVar2._0_8_ = in_stack_ffffffffffffe0e8;
  auVar2._12_4_ = in_stack_ffffffffffffe0f4;
  auVar2._16_8_ = 0;
  last._1_7_ = in_stack_ffffffffffffe0f9;
  last.node_count_._0_1_ = in_stack_ffffffffffffe0f8;
  last._8_8_ = in_stack_ffffffffffffe100;
  last.node._0_4_ = iVar8;
  last.node._4_4_ = iVar8;
  iVar9 = iVar8;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar2 << 0x40),last);
  local_1e68[0] = 1.1;
  local_1e68[1] = 0.5;
  local_1e68[2] = 100.3;
  l._M_len = 3;
  l._M_array = local_1e68;
  skiplist<double,_std::less<double>_>::skiplist(&local_a38,l);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Skiplist constructed using initialzer_list:\n",0x2c);
  if (local_a38.key.super__Vector_base<SLNode<double>_*,_std::allocator<SLNode<double>_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_a38.key.super__Vector_base<SLNode<double>_*,_std::allocator<SLNode<double>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar12 = (SLNode<double> *)0x0;
    iVar5 = 0;
  }
  else {
    pSVar12 = (*local_a38.key.
                super__Vector_base<SLNode<double>_*,_std::allocator<SLNode<double>_*>_>._M_impl.
                super__Vector_impl_data._M_start)->next;
    iVar5 = 0;
    if (pSVar12 != (SLNode<double> *)0x0) {
      iVar5 = pSVar12->count + -1;
    }
  }
  local_1ea0 = 0;
  local_1eb0 = 0;
  uStack_1ea8 = 0;
  auVar3._8_4_ = iVar5;
  auVar3._0_8_ = in_stack_ffffffffffffe0e8;
  auVar3._12_4_ = iVar5;
  auVar3._16_8_ = 0;
  auVar4._7_8_ = pSVar12;
  auVar4._0_7_ = in_stack_ffffffffffffe0f9;
  auVar4._15_4_ = iVar8;
  auVar4._19_4_ = iVar9;
  auVar4[0x17] = 0;
  display<skiplist<double,std::less<double>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar3 << 0x40),(cake_iterator<false>)(auVar4 << 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"No runtime exceptions. YAY!\n",0x1c);
  skiplist<double,_std::less<double>_>::~skiplist(&local_a38);
  skiplist<int,_std::less<int>_>::~skiplist(&local_1448);
  if (local_1e80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1e80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  skiplist<int,_std::less<int>_>::~skiplist(&local_1e50);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1ee0);
  return 0;
}

Assistant:

int main() {
    // set operations
    std::multiset<int> iset;
    for(int i=0; i<10; i++)
        iset.insert(i%5);
    iset.erase(0);
    iset.erase(0);
    iset.erase(1);
    std::multiset<int>::iterator it = iset.find(2);
    it = iset.find(7);

    cout << "The mulitset has:\n";
    for(auto e: iset) {
        cout << e << " ";
    }
    cout << "\n";

    // skip list operations, must mirror the multiset operations
    skiplist<int> iskip;

    cout << "Inserting into the skip list:\n";
    for(int i=0; i<10; i++)
    {
        iskip.insert(i%5);
        cout << i%5 << " ";
    }
    cout << "\n";

    iskip.erase(0);
    iskip.erase(0);
    iskip.erase(2);

    foundit(iskip, 2);
    foundit(iskip, 7);

	std::vector<int> v = {10, 4, 3, 6, 1};
	skiplist<int> skiplistFromVector(begin(v), end(v));
	cout << "Skiplist constructed from vector:\n";
	display(begin(skiplistFromVector), end(skiplistFromVector));

	skiplist<double> slFromInitializer = {1.1, 0.5, 100.3};
	cout << "Skiplist constructed using initialzer_list:\n";
	display(begin(slFromInitializer), end(slFromInitializer));
    cout << "No runtime exceptions. YAY!\n";
}